

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int termCanDriveIndex(WhereTerm *pTerm,SrcList_item *pSrc,Bitmask notReady)

{
  int iVar1;
  char aff;
  Bitmask notReady_local;
  SrcList_item *pSrc_local;
  WhereTerm *pTerm_local;
  
  if (pTerm->leftCursor == pSrc->iCursor) {
    if ((pTerm->eOperator & 2) == 0) {
      pTerm_local._4_4_ = 0;
    }
    else if ((pTerm->prereqRight & notReady) == 0) {
      iVar1 = sqlite3IndexAffinityOk(pTerm->pExpr,pSrc->pTab->aCol[(pTerm->u).leftColumn].affinity);
      if (iVar1 == 0) {
        pTerm_local._4_4_ = 0;
      }
      else {
        pTerm_local._4_4_ = 1;
      }
    }
    else {
      pTerm_local._4_4_ = 0;
    }
  }
  else {
    pTerm_local._4_4_ = 0;
  }
  return pTerm_local._4_4_;
}

Assistant:

static int termCanDriveIndex(
  WhereTerm *pTerm,              /* WHERE clause term to check */
  struct SrcList_item *pSrc,     /* Table we are trying to access */
  Bitmask notReady               /* Tables in outer loops of the join */
){
  char aff;
  if( pTerm->leftCursor!=pSrc->iCursor ) return 0;
  if( (pTerm->eOperator & WO_EQ)==0 ) return 0;
  if( (pTerm->prereqRight & notReady)!=0 ) return 0;
  aff = pSrc->pTab->aCol[pTerm->u.leftColumn].affinity;
  if( !sqlite3IndexAffinityOk(pTerm->pExpr, aff) ) return 0;
  return 1;
}